

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M7Getter.cpp
# Opt level: O2

bool __thiscall
M7Getter::ParseRecord
          (M7Getter *this,char *buffer,char **p_tld,size_t *tld_length,bool *has_ds,
          uint32_t *algo_code)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  char cVar8;
  
  *p_tld = buffer;
  *tld_length = 0;
  *has_ds = false;
  *algo_code = 0;
  iVar2 = 0;
  for (uVar5 = 0; bVar1 = buffer[uVar5], bVar1 != 0; uVar5 = uVar5 + 1) {
    if ((0x19 < (byte)((bVar1 & 0xdf) + 0xbf)) && (bVar1 != 0x2d && 9 < (byte)(bVar1 - 0x30))) {
      if (bVar1 != 0x2e) break;
      iVar2 = iVar2 + 1;
    }
  }
  if (1 < iVar2 || uVar5 < 3) {
    return false;
  }
  *tld_length = uVar5 - 1;
  bVar1 = buffer[uVar5];
  if ((bVar1 == 9) || (bVar1 == 0x20)) {
    do {
      do {
        uVar5 = uVar5 + 1;
        bVar1 = buffer[uVar5];
      } while (bVar1 == 0x20);
    } while (bVar1 == 9);
    bVar4 = true;
  }
  else {
    bVar4 = false;
  }
  if ((byte)(bVar1 - 0x3a) < 0xf6) {
    bVar4 = false;
  }
  else {
    do {
      bVar1 = buffer[uVar5 + 1];
      uVar5 = uVar5 + 1;
    } while ((byte)(bVar1 - 0x30) < 10);
  }
  if ((bVar1 == 0x20) || (bVar1 == 9)) {
    do {
      do {
        uVar5 = uVar5 + 1;
        bVar1 = buffer[uVar5];
      } while (bVar1 == 0x20);
    } while (bVar1 == 9);
  }
  else {
    bVar4 = false;
  }
  if (((bVar1 | 0x20) == 0x69) && ((byte)(buffer[uVar5 + 1] | 0x20U) == 0x6e)) {
    bVar1 = buffer[uVar5 + 2];
    uVar5 = uVar5 + 2;
  }
  else {
    bVar4 = false;
  }
  if ((bVar1 == 0x20) || (bVar1 == 9)) {
    do {
      do {
        uVar5 = uVar5 + 1;
        bVar1 = buffer[uVar5];
      } while (bVar1 == 0x20);
    } while (bVar1 == 9);
  }
  else {
    bVar4 = false;
  }
  if ((((bVar1 | 0x20) == 100) && ((byte)(buffer[uVar5 + 1] | 0x20U) == 0x73)) &&
     ((buffer[uVar5 + 2] == ' ' || (buffer[uVar5 + 2] == '\t')))) {
    *has_ds = true;
    for (lVar6 = uVar5 + 3; (cVar8 = buffer[lVar6], cVar8 == ' ' || (cVar8 == '\t'));
        lVar6 = lVar6 + 1) {
    }
    if ((byte)(cVar8 - 0x3aU) < 0xf6) {
      bVar4 = false;
    }
    else {
      do {
        cVar8 = buffer[lVar6 + 1];
        lVar6 = lVar6 + 1;
      } while ((byte)(cVar8 - 0x30U) < 10);
    }
    if ((cVar8 == ' ') || (cVar8 == '\t')) {
      do {
        do {
          lVar6 = lVar6 + 1;
          cVar8 = buffer[lVar6];
        } while (cVar8 == ' ');
      } while (cVar8 == '\t');
    }
    else {
      bVar4 = false;
    }
    uVar3 = 0;
    if ((byte)(cVar8 - 0x3aU) < 0xf6) {
      return false;
    }
    pcVar7 = buffer + lVar6;
    while ((byte)(cVar8 - 0x30U) < 10) {
      if (0x1ffffff < uVar3) {
        return false;
      }
      *algo_code = uVar3 * 10;
      uVar3 = (uVar3 * 10 + (int)*pcVar7) - 0x30;
      *algo_code = uVar3;
      cVar8 = pcVar7[1];
      pcVar7 = pcVar7 + 1;
    }
  }
  return bVar4;
}

Assistant:

bool M7Getter::ParseRecord(char * buffer, char ** p_tld, size_t * tld_length, bool * has_ds, uint32_t* algo_code)
{
    bool ret = true;
    size_t i = 0;
    int x;
    int nb_dots = 0;


    *p_tld = buffer;
    *tld_length = 0;
    *has_ds = false;
    *algo_code = 0;

    for (i = 0; (x = buffer[i]) != 0; i++)
    {
        if ((x >= 'a' && x <= 'z') || (x >= 'A' && x <= 'Z') ||
            (x >= '0' && x <= '9') || (x == '-'))
        {
            continue;
        }
        else if (x == '.')
        {
            nb_dots++;
        }
        else
        {
            break;
        }
    }

    if (i <= 2 || nb_dots > 1)
    {
        ret = false;
    }
    else
    {
        *tld_length = i - 1;

        /* skip spaces */
        if (buffer[i] != ' ' && buffer[i] != '\t')
        {
            ret = false;
        }
        else
        {
            do
            {
                i++;
            } while (buffer[i] == ' ' || buffer[i] == '\t');
        }
        /* skip TTL */
        if (buffer[i] < '0' || buffer[i] > '9')
        {
            ret = false;
        }
        else
        {
            do
            {
                i++;
            } while (buffer[i] >= '0' && buffer[i] <= '9');
        }
        /* skip more spaces */
        if (buffer[i] != ' ' && buffer[i] != '\t')
        {
            ret = false;
        }
        else
        {
            do
            {
                i++;
            } while (buffer[i] == ' ' || buffer[i] == '\t');
        }
        /* skip CLASS */
        if ((buffer[i] == 'i' || buffer[i] == 'I') &&
            (buffer[i+1] == 'n' || buffer[i+1] == 'N'))
        {
            i += 2;
        }
        else
        {
            ret = false;
        }
        /* skip more space*/
        if (buffer[i] != ' ' && buffer[i] != '\t')
        {
            ret = false;
        }
        else
        {
            do
            {
                i++;
            } while (buffer[i] == ' ' || buffer[i] == '\t');
        }
        /* check ds_bit */
        if ((buffer[i] == 'd' || buffer[i] == 'D') &&
            (buffer[i + 1] == 's' || buffer[i + 1] == 'S') &&
            (buffer[i + 2] == ' ' || buffer[i + 2] == '\t'))
        {
            *has_ds = true;
            i += 2;
            /* skip space until next number */
            do
            {
                i++;
            } while (buffer[i] == ' ' || buffer[i] == '\t');

            /* skip digits (key ID) */
            if (buffer[i] < '0' || buffer[i] > '9')
            {
                ret = false;
            }
            else
            {
                do
                {
                    i++;
                } while (buffer[i] >= '0' && buffer[i] <= '9');
            }
            /* Skip more spaces */
            if (buffer[i] != ' ' && buffer[i] != '\t')
            {
                ret = false;
            }
            else
            {
                do
                {
                    i++;
                } while (buffer[i] == ' ' || buffer[i] == '\t');
            }
            /* Compute algorithm number */
            if (buffer[i] < '0' || buffer[i] > '9')
            {
                ret = false;
            }
            else while (buffer[i] >= '0' && buffer[i] <= '9')
            {
                if (*algo_code > 0x1FFFFFF) {
                    ret = false;
                    break;
                }
                *algo_code *= 10;
                *algo_code += (uint32_t)(buffer[i] - '0');
                i++;
            }
        }
    }

    return ret;
}